

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O0

LY_ERR lyd_print_fd(int fd,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  ly_out *plStack_30;
  LY_ERR ret__;
  ly_out *out;
  uint32_t local_20;
  LY_ERR ret;
  uint32_t options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  int fd_local;
  
  local_20 = options;
  ret = format;
  _options_local = root;
  root_local._0_4_ = fd;
  if (fd == -1) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","fd != -1","lyd_print_fd")
    ;
    root_local._4_4_ = LY_EINVAL;
  }
  else {
    root_local._4_4_ = ly_out_new_fd(fd,&stack0xffffffffffffffd0);
    if (root_local._4_4_ == LY_SUCCESS) {
      out._4_4_ = lyd_print_(plStack_30,_options_local,ret,local_20);
      ly_out_free(plStack_30,(_func_void_void_ptr *)0x0,'\0');
      root_local._4_4_ = out._4_4_;
    }
  }
  return root_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_print_fd(int fd, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_ERR ret;
    struct ly_out *out;

    LY_CHECK_ARG_RET(NULL, fd != -1, LY_EINVAL);

    LY_CHECK_RET(ly_out_new_fd(fd, &out));
    ret = lyd_print_(out, root, format, options);
    ly_out_free(out, NULL, 0);
    return ret;
}